

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int uv__io_fork(uv_loop_t *loop)

{
  watcher_list *root_00;
  watcher_root *pwVar1;
  watcher_list *root;
  int err;
  uv_loop_t *loop_local;
  
  pwVar1 = uv__inotify_watchers(loop);
  root_00 = pwVar1->rbh_root;
  uv__close(loop->backend_fd);
  loop->backend_fd = -1;
  uv__platform_loop_delete(loop);
  loop_local._4_4_ = uv__platform_loop_init(loop);
  if (loop_local._4_4_ == 0) {
    loop_local._4_4_ = uv__inotify_fork(loop,root_00);
  }
  return loop_local._4_4_;
}

Assistant:

int uv__io_fork(uv_loop_t* loop) {
  int err;
  struct watcher_list* root;

  root = uv__inotify_watchers(loop)->rbh_root;

  uv__close(loop->backend_fd);
  loop->backend_fd = -1;

  /* TODO(bnoordhuis) Loses items from the submission and completion rings. */
  uv__platform_loop_delete(loop);

  err = uv__platform_loop_init(loop);
  if (err)
    return err;

  return uv__inotify_fork(loop, root);
}